

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Target.hpp
# Opt level: O0

void __thiscall Analyser::Static::Enterprise::Target::Target(Target *this)

{
  bool bVar1;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_41;
  string local_40;
  Target *local_10;
  Target *this_local;
  
  local_10 = this;
  Static::Target::Target(&this->super_Target,Enterprise);
  Reflection::StructImpl<Analyser::Static::Enterprise::Target>::StructImpl
            (&this->super_StructImpl<Analyser::Static::Enterprise::Target>);
  (this->super_Target)._vptr_Target = (_func_int **)&PTR__Target_00c94708;
  (this->super_StructImpl<Analyser::Static::Enterprise::Target>).super_Struct._vptr_Struct =
       (_func_int **)&DAT_00c94728;
  this->model = Enterprise128;
  this->exos_version = Any;
  this->basic_version = None;
  this->dos = None;
  this->speed = FourMHz;
  std::__cxx11::string::string((string *)&this->loading_command);
  bVar1 = Reflection::StructImpl<Analyser::Static::Enterprise::Target>::needs_declare
                    (&this->super_StructImpl<Analyser::Static::Enterprise::Target>);
  if (bVar1) {
    Reflection::Enum::declare<Analyser::Static::Enterprise::Target::Model>
              ("Model","Enterprise64, Enterprise128, Enterprise256");
    Reflection::Enum::declare<Analyser::Static::Enterprise::Target::EXOSVersion>
              ("EXOSVersion","v10, v20, v21, v23, Any");
    Reflection::Enum::declare<Analyser::Static::Enterprise::Target::BASICVersion>
              ("BASICVersion","v10, v11, v21, Any, None");
    Reflection::Enum::declare<Analyser::Static::Enterprise::Target::DOS>("DOS","EXDOS, None");
    Reflection::Enum::declare<Analyser::Static::Enterprise::Target::Speed>
              ("Speed","FourMHz, SixMHz");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"model",&local_41);
    Reflection::StructImpl<Analyser::Static::Enterprise::Target>::
    declare<Analyser::Static::Enterprise::Target::Model>
              (&this->super_StructImpl<Analyser::Static::Enterprise::Target>,&this->model,&local_40)
    ;
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"exos_version",&local_69)
    ;
    Reflection::StructImpl<Analyser::Static::Enterprise::Target>::
    declare<Analyser::Static::Enterprise::Target::EXOSVersion>
              (&this->super_StructImpl<Analyser::Static::Enterprise::Target>,&this->exos_version,
               &local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"basic_version",&local_91);
    Reflection::StructImpl<Analyser::Static::Enterprise::Target>::
    declare<Analyser::Static::Enterprise::Target::BASICVersion>
              (&this->super_StructImpl<Analyser::Static::Enterprise::Target>,&this->basic_version,
               &local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"dos",&local_b9);
    Reflection::StructImpl<Analyser::Static::Enterprise::Target>::
    declare<Analyser::Static::Enterprise::Target::DOS>
              (&this->super_StructImpl<Analyser::Static::Enterprise::Target>,&this->dos,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"speed",&local_e1);
    Reflection::StructImpl<Analyser::Static::Enterprise::Target>::
    declare<Analyser::Static::Enterprise::Target::Speed>
              (&this->super_StructImpl<Analyser::Static::Enterprise::Target>,&this->speed,&local_e0)
    ;
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
  }
  return;
}

Assistant:

Target() : Analyser::Static::Target(Machine::Enterprise) {
		if(needs_declare()) {
			AnnounceEnum(Model);
			AnnounceEnum(EXOSVersion);
			AnnounceEnum(BASICVersion);
			AnnounceEnum(DOS);
			AnnounceEnum(Speed);

			DeclareField(model);
			DeclareField(exos_version);
			DeclareField(basic_version);
			DeclareField(dos);
			DeclareField(speed);
		}
	}